

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-conversion.cc
# Opt level: O3

size_t __thiscall
EncodingConversion::encode
          (EncodingConversion *this,u16string *string,size_t *start_offset,size_t end_offset,
          char *output_buffer,size_t output_length,bool is_at_end)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint16_t replacement_characters [2];
  char *replacement_text;
  char *output_pointer;
  char local_64 [4];
  pointer local_60;
  pointer local_58;
  size_t *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  pcVar1 = (string->_M_dataplus)._M_p;
  local_60 = pcVar1 + *start_offset;
  local_58 = local_60;
  local_50 = start_offset;
  local_48 = output_buffer;
  local_38 = output_buffer;
  do {
    while (uVar3 = convert(this,(char **)&local_60,(char *)(pcVar1 + end_offset),&local_38,
                           output_buffer + output_length), uVar3 == 2) {
      bVar2 = false;
LAB_0016010d:
      local_64[0] = -3;
      local_64[1] = -1;
      local_64[2] = '\0';
      local_64[3] = '\0';
      local_40 = local_64;
      iVar4 = convert(this,&local_40,local_64 + 2,&local_38,output_buffer + output_length);
      if ((iVar4 != 0) || (local_60 = local_60 + 1, bVar2)) goto LAB_00160145;
    }
    if (uVar3 == 3) {
      bVar2 = true;
      if (is_at_end) goto LAB_0016010d;
      goto LAB_00160145;
    }
    if (uVar3 < 2) {
LAB_00160145:
      *local_50 = *local_50 + ((long)local_60 - (long)local_58) / 2;
      return (long)local_38 - (long)local_48;
    }
  } while( true );
}

Assistant:

size_t EncodingConversion::encode(const u16string &string, size_t *start_offset,
                                  size_t end_offset, char *output_buffer,
                                  size_t output_length, bool is_at_end) {
  const char *input_start = reinterpret_cast<const char *>(string.data() + *start_offset);
  const char *input_end = reinterpret_cast<const char *>(string.data() + end_offset);
  const char *input_pointer = input_start;
  char *output_pointer = output_buffer;
  char *output_end = output_buffer + output_length;

  bool done = false;
  while (!done) {
    int conversion_result = convert(
      &input_pointer,
      input_end,
      &output_pointer,
      output_end
    );

    switch (conversion_result) {
      case Ok:
      case Partial:
        done = true;
        break;

      case InvalidTrailing:
        done = true;
        if (!is_at_end) break;

      case Invalid:
        uint16_t replacement_characters[] = {replacement_character, 0};
        const char *replacement_text = reinterpret_cast<const char *>(replacement_characters);
        if (convert(
          &replacement_text,
          replacement_text + bytes_per_character,
          &output_pointer,
          output_end
        ) != Ok) {
          done = true;
        } else {
          input_pointer += bytes_per_character;
        }
        break;
    }
  }

  *start_offset += (input_pointer - input_start) / bytes_per_character;
  return output_pointer - output_buffer;
}